

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O1

void parse_charstrings(T1_Face face,T1_Loader loader)

{
  byte bVar1;
  FT_Memory pFVar2;
  FT_Byte *pFVar3;
  byte *pbVar4;
  byte *pbVar5;
  bool bVar6;
  PS_Table pPVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar12;
  FT_Pointer __dest;
  ulong uVar13;
  char cVar14;
  byte *pbVar15;
  uint uVar16;
  long lVar17;
  FT_Error error;
  FT_ULong size;
  FT_Byte *base;
  FT_Error local_8c;
  int local_88;
  int local_84;
  PS_Table local_80;
  uint local_74;
  PS_Table local_70;
  PS_Table local_68;
  FT_Memory local_60;
  ulong local_58;
  T1_Face local_50;
  undefined8 *local_48;
  FT_Pointer local_40;
  FT_Byte *local_38;
  FT_Long FVar11;
  
  pFVar2 = (loader->parser).root.memory;
  local_48 = (undefined8 *)face->psaux;
  pFVar3 = (loader->parser).root.cursor;
  pbVar4 = (loader->parser).root.limit;
  FVar11 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
  uVar8 = (uint)FVar11;
  if (-1 < (int)uVar8) {
    lVar17 = (long)pbVar4 - (long)pFVar3 >> 3;
    uVar16 = (uint)lVar17;
    if ((long)(ulong)(uVar8 & 0x7fffffff) <= lVar17) {
      uVar16 = uVar8;
    }
    if (uVar16 == 0) {
      return;
    }
    if ((loader->parser).root.error != 0) {
      return;
    }
    local_80 = &loader->charstrings;
    local_68 = &loader->glyph_names;
    local_70 = &loader->swap_table;
    local_60 = pFVar2;
    local_50 = face;
    if (loader->num_glyphs == 0) {
      local_8c = (**(code **)*local_48)(local_80,uVar16 + 6,pFVar2);
      if (((local_8c != 0) ||
          (local_8c = (**(code **)*local_48)(local_68,uVar16 + 6,local_60), local_8c != 0)) ||
         (local_8c = (**(code **)*local_48)(local_70,4,local_60), local_8c != 0))
      goto switchD_00179f9e_caseD_2;
    }
    local_84 = 0;
    local_74 = 0;
    local_88 = 0;
switchD_00179f9e_caseD_0:
    (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
    pbVar15 = (loader->parser).root.cursor;
    cVar14 = '\x05';
    if (pbVar4 <= pbVar15) goto LAB_00179f89;
    if (pbVar15 + 3 < pbVar4) {
      bVar1 = pbVar15[3];
      if (((0x3e < (ulong)bVar1) || ((0x5000832100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
         ((0x22 < bVar1 - 0x5b || ((0x500000005U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) == 0))))
      goto LAB_00179e20;
      if (*pbVar15 == 0x65) {
        if ((pbVar15[1] != 0x6e) || (pbVar15[2] != 100)) goto LAB_00179e20;
      }
      else if (((*pbVar15 != 100) || (pbVar15[1] != 0x65)) ||
              ((pbVar15[2] != 0x66 || (local_88 == 0)))) goto LAB_00179e20;
    }
    else {
LAB_00179e20:
      (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
      pbVar5 = (loader->parser).root.cursor;
      if (pbVar5 < pbVar4) {
        cVar14 = '\x01';
        if ((loader->parser).root.error == 0) {
          if (*pbVar15 == 0x2f) {
            if (pbVar4 <= pbVar15 + 2) goto LAB_00179f74;
            iVar9 = read_binary_data(&loader->parser,&local_58,&local_38,
                                     ((local_50->root).internal)->incremental_interface !=
                                     (FT_Incremental_InterfaceRec *)0x0);
            if ((iVar9 != 0) && (cVar14 = '\x06', loader->num_glyphs == 0)) {
              pbVar15 = pbVar15 + 1;
              uVar13 = (long)pbVar5 - (long)pbVar15;
              local_8c = (*(loader->glyph_names).funcs.add)
                                   (local_68,local_88,pbVar15,(int)uVar13 + 1);
              iVar9 = local_88;
              cVar14 = '\x02';
              if (local_8c == 0) {
                (loader->glyph_names).elements[local_88][uVar13 & 0xffffffff] = '\0';
                if (*pbVar15 == 0x2e) {
                  iVar10 = strcmp(".notdef",(char *)(loader->glyph_names).elements[local_88]);
                  if (iVar10 == 0) {
                    local_84 = iVar9;
                  }
                  local_74 = local_74 & 0xff;
                  if (iVar10 == 0) {
                    local_74 = 1;
                  }
                }
                uVar13 = local_58;
                uVar12 = (ulong)(local_50->type1).private_dict.lenIV;
                if (((long)uVar12 < 0) || ((int)(uVar16 + 5) <= iVar9)) {
                  local_8c = (*(loader->charstrings).funcs.add)
                                       (local_80,iVar9,local_38,(FT_UInt)local_58);
                }
                else {
                  if (uVar12 < local_58) {
                    __dest = ft_mem_alloc(local_60,local_58,&local_8c);
                    cVar14 = '\0';
                    if (local_8c == 0) {
                      local_40 = __dest;
                      memcpy(__dest,local_38,uVar13);
                      (*(code *)local_48[4])(local_40,uVar13,0x10ea);
                      lVar17 = (long)(local_50->type1).private_dict.lenIV;
                      local_58 = uVar13 - lVar17;
                      local_8c = (*(loader->charstrings).funcs.add)
                                           (local_80,local_88,(void *)((long)local_40 + lVar17),
                                            (FT_UInt)local_58);
                      ft_mem_free(local_60,local_40);
                      bVar6 = true;
                    }
                    else {
                      cVar14 = '\x02';
                      bVar6 = false;
                    }
                  }
                  else {
                    local_8c = 3;
                    cVar14 = '\x02';
                    bVar6 = false;
                  }
                  if (!bVar6) goto LAB_00179f89;
                }
                cVar14 = (local_8c != 0) * '\x02';
                local_88 = local_88 + (uint)(local_8c == 0);
              }
            }
          }
          else {
            cVar14 = '\0';
          }
        }
      }
      else {
LAB_00179f74:
        local_8c = 3;
        cVar14 = '\x02';
      }
    }
LAB_00179f89:
    pPVar7 = local_70;
    iVar9 = local_88;
    switch(cVar14) {
    case '\0':
    case '\x06':
      goto switchD_00179f9e_caseD_0;
    default:
      goto switchD_00179f9e_caseD_1;
    case '\x02':
      goto switchD_00179f9e_caseD_2;
    case '\x05':
      if (local_88 == 0) break;
      loader->num_glyphs = local_88;
      if ((char)local_74 == '\0') {
        local_58 = CONCAT35(local_58._5_3_,0xe00000000);
        local_58 = CONCAT44(local_58._4_4_,0xde1f78b);
        local_8c = (*(loader->swap_table).funcs.add)
                             (local_70,0,*(loader->glyph_names).elements,
                              *(loader->glyph_names).lengths);
        if (((((local_8c == 0) &&
              (local_8c = (*(loader->swap_table).funcs.add)
                                    (pPVar7,1,*(loader->charstrings).elements,
                                     *(loader->charstrings).lengths), local_8c == 0)) &&
             (local_8c = (*(loader->glyph_names).funcs.add)(local_68,0,".notdef",8), local_8c == 0))
            && ((local_8c = (*(loader->charstrings).funcs.add)(local_80,0,&local_58,5),
                local_8c == 0 &&
                (local_8c = (*(loader->glyph_names).funcs.add)
                                      (local_68,iVar9,*(loader->swap_table).elements,
                                       *(loader->swap_table).lengths), local_8c == 0)))) &&
           (local_8c = (*(loader->charstrings).funcs.add)
                                 (local_80,iVar9,(loader->swap_table).elements[1],
                                  (loader->swap_table).lengths[1]), local_8c == 0)) {
          loader->num_glyphs = loader->num_glyphs + 1;
          return;
        }
      }
      else {
        pFVar3 = *(loader->glyph_names).elements;
        iVar9 = strcmp(".notdef",(char *)pFVar3);
        if (iVar9 == 0) {
          return;
        }
        local_8c = (*(loader->swap_table).funcs.add)
                             (local_70,0,pFVar3,*(loader->glyph_names).lengths);
        if ((local_8c == 0) &&
           (local_8c = (*(loader->swap_table).funcs.add)
                                 (local_70,1,*(loader->charstrings).elements,
                                  *(loader->charstrings).lengths), local_8c == 0)) {
          lVar17 = (long)local_84;
          local_8c = (*(loader->swap_table).funcs.add)
                               (local_70,2,(loader->glyph_names).elements[lVar17],
                                (loader->glyph_names).lengths[lVar17]);
          if (((local_8c == 0) &&
              (((local_8c = (*(loader->swap_table).funcs.add)
                                      (local_70,3,(loader->charstrings).elements[lVar17],
                                       (loader->charstrings).lengths[lVar17]), local_8c == 0 &&
                (local_8c = (*(loader->glyph_names).funcs.add)
                                      (local_68,local_84,*(loader->swap_table).elements,
                                       *(loader->swap_table).lengths), local_8c == 0)) &&
               (local_8c = (*(loader->charstrings).funcs.add)
                                     (local_80,local_84,(loader->swap_table).elements[1],
                                      (loader->swap_table).lengths[1]), local_8c == 0)))) &&
             ((local_8c = (*(loader->glyph_names).funcs.add)
                                    (local_68,0,(loader->swap_table).elements[2],
                                     (loader->swap_table).lengths[2]), local_8c == 0 &&
              (local_8c = (*(loader->charstrings).funcs.add)
                                    (local_80,0,(loader->swap_table).elements[3],
                                     (loader->swap_table).lengths[3]), local_8c == 0)))) {
            return;
          }
        }
      }
      goto switchD_00179f9e_caseD_2;
    }
  }
  local_8c = 3;
switchD_00179f9e_caseD_2:
  (loader->parser).root.error = local_8c;
switchD_00179f9e_caseD_1:
  return;
}

Assistant:

static void
  parse_charstrings( T1_Face    face,
                     T1_Loader  loader )
  {
    T1_Parser      parser       = &loader->parser;
    PS_Table       code_table   = &loader->charstrings;
    PS_Table       name_table   = &loader->glyph_names;
    PS_Table       swap_table   = &loader->swap_table;
    FT_Memory      memory       = parser->root.memory;
    FT_Error       error;

    PSAux_Service  psaux        = (PSAux_Service)face->psaux;

    FT_Byte*       cur          = parser->root.cursor;
    FT_Byte*       limit        = parser->root.limit;
    FT_Int         n, num_glyphs;
    FT_Int         notdef_index = 0;
    FT_Byte        notdef_found = 0;


    num_glyphs = (FT_Int)T1_ToInt( parser );
    if ( num_glyphs < 0 )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    /* we certainly need more than 8 bytes per glyph */
    if ( num_glyphs > ( limit - cur ) >> 3 )
    {
      FT_TRACE0(( "parse_charstrings: adjusting number of glyphs"
                  " (from %d to %d)\n",
                  num_glyphs, ( limit - cur ) >> 3 ));
      num_glyphs = ( limit - cur ) >> 3;
    }

    /* some fonts like Optima-Oblique not only define the /CharStrings */
    /* array but access it also                                        */
    if ( num_glyphs == 0 || parser->root.error )
      return;

    /* initialize tables, leaving space for addition of .notdef, */
    /* if necessary, and a few other glyphs to handle buggy      */
    /* fonts which have more glyphs than specified.              */

    /* for some non-standard fonts like `Optima' which provides  */
    /* different outlines depending on the resolution it is      */
    /* possible to get here twice                                */
    if ( !loader->num_glyphs )
    {
      error = psaux->ps_table_funcs->init(
                code_table, num_glyphs + 1 + TABLE_EXTEND, memory );
      if ( error )
        goto Fail;

      error = psaux->ps_table_funcs->init(
                name_table, num_glyphs + 1 + TABLE_EXTEND, memory );
      if ( error )
        goto Fail;

      /* Initialize table for swapping index notdef_index and */
      /* index 0 names and codes (if necessary).              */

      error = psaux->ps_table_funcs->init( swap_table, 4, memory );
      if ( error )
        goto Fail;
    }

    n = 0;

    for (;;)
    {
      FT_ULong  size;
      FT_Byte*  base;


      /* the format is simple:        */
      /*   `/glyphname' + binary data */

      T1_Skip_Spaces( parser );

      cur = parser->root.cursor;
      if ( cur >= limit )
        break;

      /* we stop when we find a `def' or `end' keyword */
      if ( cur + 3 < limit && IS_PS_DELIM( cur[3] ) )
      {
        if ( cur[0] == 'd' &&
             cur[1] == 'e' &&
             cur[2] == 'f' )
        {
          /* There are fonts which have this: */
          /*                                  */
          /*   /CharStrings 118 dict def      */
          /*   Private begin                  */
          /*   CharStrings begin              */
          /*   ...                            */
          /*                                  */
          /* To catch this we ignore `def' if */
          /* no charstring has actually been  */
          /* seen.                            */
          if ( n )
            break;
        }

        if ( cur[0] == 'e' &&
             cur[1] == 'n' &&
             cur[2] == 'd' )
          break;
      }

      T1_Skip_PS_Token( parser );
      if ( parser->root.cursor >= limit )
      {
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }
      if ( parser->root.error )
        return;

      if ( *cur == '/' )
      {
        FT_UInt  len;


        if ( cur + 2 >= limit )
        {
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        cur++;                              /* skip `/' */
        len = (FT_UInt)( parser->root.cursor - cur );

        if ( !read_binary_data( parser, &size, &base, IS_INCREMENTAL ) )
          return;

        /* for some non-standard fonts like `Optima' which provides */
        /* different outlines depending on the resolution it is     */
        /* possible to get here twice                               */
        if ( loader->num_glyphs )
          continue;

        error = T1_Add_Table( name_table, n, cur, len + 1 );
        if ( error )
          goto Fail;

        /* add a trailing zero to the name table */
        name_table->elements[n][len] = '\0';

        /* record index of /.notdef */
        if ( *cur == '.'                                              &&
             ft_strcmp( ".notdef",
                        (const char*)(name_table->elements[n]) ) == 0 )
        {
          notdef_index = n;
          notdef_found = 1;
        }

        if ( face->type1.private_dict.lenIV >= 0 &&
             n < num_glyphs + TABLE_EXTEND       )
        {
          FT_Byte*  temp = NULL;


          if ( size <= (FT_ULong)face->type1.private_dict.lenIV )
          {
            error = FT_THROW( Invalid_File_Format );
            goto Fail;
          }

          /* t1_decrypt() shouldn't write to base -- make temporary copy */
          if ( FT_ALLOC( temp, size ) )
            goto Fail;
          FT_MEM_COPY( temp, base, size );
          psaux->t1_decrypt( temp, size, 4330 );
          size -= (FT_ULong)face->type1.private_dict.lenIV;
          error = T1_Add_Table( code_table, n,
                                temp + face->type1.private_dict.lenIV, size );
          FT_FREE( temp );
        }
        else
          error = T1_Add_Table( code_table, n, base, size );
        if ( error )
          goto Fail;

        n++;
      }
    }

    if ( !n )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    loader->num_glyphs = n;

    /* if /.notdef is found but does not occupy index 0, do our magic. */
    if ( notdef_found                                                 &&
         ft_strcmp( ".notdef", (const char*)name_table->elements[0] ) )
    {
      /* Swap glyph in index 0 with /.notdef glyph.  First, add index 0  */
      /* name and code entries to swap_table.  Then place notdef_index   */
      /* name and code entries into swap_table.  Then swap name and code */
      /* entries at indices notdef_index and 0 using values stored in    */
      /* swap_table.                                                     */

      /* Index 0 name */
      error = T1_Add_Table( swap_table, 0,
                            name_table->elements[0],
                            name_table->lengths [0] );
      if ( error )
        goto Fail;

      /* Index 0 code */
      error = T1_Add_Table( swap_table, 1,
                            code_table->elements[0],
                            code_table->lengths [0] );
      if ( error )
        goto Fail;

      /* Index notdef_index name */
      error = T1_Add_Table( swap_table, 2,
                            name_table->elements[notdef_index],
                            name_table->lengths [notdef_index] );
      if ( error )
        goto Fail;

      /* Index notdef_index code */
      error = T1_Add_Table( swap_table, 3,
                            code_table->elements[notdef_index],
                            code_table->lengths [notdef_index] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, notdef_index,
                            swap_table->elements[0],
                            swap_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, notdef_index,
                            swap_table->elements[1],
                            swap_table->lengths [1] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, 0,
                            swap_table->elements[2],
                            swap_table->lengths [2] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, 0,
                            swap_table->elements[3],
                            swap_table->lengths [3] );
      if ( error )
        goto Fail;

    }
    else if ( !notdef_found )
    {
      /* notdef_index is already 0, or /.notdef is undefined in   */
      /* charstrings dictionary.  Worry about /.notdef undefined. */
      /* We take index 0 and add it to the end of the table(s)    */
      /* and add our own /.notdef glyph to index 0.               */

      /* 0 333 hsbw endchar */
      FT_Byte  notdef_glyph[] = { 0x8B, 0xF7, 0xE1, 0x0D, 0x0E };
      char*    notdef_name    = (char *)".notdef";


      error = T1_Add_Table( swap_table, 0,
                            name_table->elements[0],
                            name_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( swap_table, 1,
                            code_table->elements[0],
                            code_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, 0, notdef_name, 8 );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, 0, notdef_glyph, 5 );

      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, n,
                            swap_table->elements[0],
                            swap_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, n,
                            swap_table->elements[1],
                            swap_table->lengths [1] );
      if ( error )
        goto Fail;

      /* we added a glyph. */
      loader->num_glyphs += 1;
    }

    return;

  Fail:
    parser->root.error = error;
  }